

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O3

data_ptr * cpptempl::make_data(data_ptr *__return_storage_ptr__,string *val)

{
  pointer pcVar1;
  DataValue *__p;
  long *local_48;
  long local_40;
  long local_38 [2];
  
  __p = (DataValue *)operator_new(0x28);
  pcVar1 = (val->_M_dataplus)._M_p;
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + val->_M_string_length);
  (__p->super_Data)._vptr_Data = (_func_int **)&PTR_empty_0020b768;
  (__p->m_value)._M_dataplus._M_p = (pointer)&(__p->m_value).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__p->m_value,local_48,local_40 + (long)local_48);
  __return_storage_ptr__->_vptr_data_ptr = (_func_int **)&PTR__data_ptr_0020bde8;
  (__return_storage_ptr__->ptr).super___shared_ptr<cpptempl::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)__p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<cpptempl::DataValue*>
            (&(__return_storage_ptr__->ptr).
              super___shared_ptr<cpptempl::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount,__p);
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline data_ptr make_data(std::string val)
    {
        return data_ptr(new DataValue(val)) ;
    }